

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DoFilter2_C(uint8_t *p,int step)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  int a2;
  int a1;
  int a;
  int q1;
  int q0;
  int p0;
  int p1;
  int step_local;
  uint8_t *p_local;
  
  bVar1 = *p;
  iVar3 = ((uint)bVar1 - (uint)p[-step]) * 3 +
          (int)(char)sclip1[(long)(int)((uint)p[step * -2] - (uint)p[step]) + 0x3fc];
  uVar2 = sclip2[(long)(iVar3 + 4 >> 3) + 0x70];
  p[-step] = ""[(long)(int)((uint)p[-step] + (int)(char)sclip2[(long)(iVar3 + 3 >> 3) + 0x70]) +
                0xff];
  *p = ""[(long)(int)((uint)bVar1 - (int)(char)uVar2) + 0xff];
  return;
}

Assistant:

static WEBP_INLINE void DoFilter2_C(uint8_t* p, int step) {
  const int p1 = p[-2*step], p0 = p[-step], q0 = p[0], q1 = p[step];
  const int a = 3 * (q0 - p0) + VP8ksclip1[p1 - q1];  // in [-893,892]
  const int a1 = VP8ksclip2[(a + 4) >> 3];            // in [-16,15]
  const int a2 = VP8ksclip2[(a + 3) >> 3];
  p[-step] = VP8kclip1[p0 + a2];
  p[    0] = VP8kclip1[q0 - a1];
}